

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sanity.cpp
# Opt level: O1

void __thiscall
cubeb_basic_stream_operations_Test::TestBody(cubeb_basic_stream_operations_Test *this)

{
  bool bVar1;
  stringstream *psVar2;
  AssertHelperData *this_00;
  int iVar3;
  anon_enum_32 *in_RCX;
  anon_enum_32 *paVar4;
  cubeb_stream **val1;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  char *pcVar5;
  AssertHelper local_80;
  AssertionResult gtest_ar_2;
  int r;
  uint64_t position;
  cubeb_stream *stream;
  AssertHelper local_50;
  uint32_t latency;
  cubeb *ctx;
  AssertionResult gtest_ar;
  
  r = common_init(&ctx,"test_sanity");
  gtest_ar_2._0_8_ = (ulong)(uint)gtest_ar_2._4_4_ << 0x20;
  testing::internal::EqHelper<false>::Compare<int,__0>
            (&gtest_ar.success_,(char *)&r,(int *)&gtest_ar_2,in_RCX);
  if (gtest_ar.success_ == false) {
    psVar2 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar2);
    *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    iVar3 = 0x196;
    gtest_ar_2._0_8_ = psVar2;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar_2.success_ = false;
    gtest_ar_2._1_7_ = 0;
    testing::internal::CmpHelperNE<cubeb*,decltype(nullptr)>
              ((internal *)&gtest_ar,"ctx","nullptr",&ctx,(void **)&gtest_ar_2);
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0xac44000000;
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x400000001;
      paVar4 = (anon_enum_32 *)0x0;
      r = cubeb_stream_init(ctx,&stream,"test",(cubeb_devid)0x0,(cubeb_stream_params *)0x0,
                            (cubeb_devid)0x0,(cubeb_stream_params *)&gtest_ar,0x113a,
                            test_data_callback,test_state_callback,&dummy);
      position = (ulong)position._4_4_ << 0x20;
      testing::internal::EqHelper<false>::Compare<int,__0>
                (&gtest_ar_2.success_,(char *)&r,(int *)&position,paVar4);
      if (gtest_ar_2.success_ == false) {
        psVar2 = (stringstream *)operator_new(0x188);
        std::__cxx11::stringstream::stringstream(psVar2);
        *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
        if (gtest_ar_2.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
        }
        iVar3 = 0x1a1;
        position = (uint64_t)psVar2;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar_2.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        position = 0;
        val1 = &stream;
        testing::internal::CmpHelperNE<cubeb_stream*,decltype(nullptr)>
                  ((internal *)&gtest_ar_2,"stream","nullptr",val1,(void **)&position);
        if (gtest_ar_2.success_ != false) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&gtest_ar_2.message_,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          r = cubeb_stream_get_position(stream,&position);
          local_80.data_._0_4_ = 0;
          testing::internal::EqHelper<false>::Compare<int,__0>
                    (&gtest_ar_2.success_,(char *)&r,(int *)&local_80,(anon_enum_32 *)val1);
          if (gtest_ar_2.success_ == false) {
            this_00 = (AssertHelperData *)operator_new(0x188);
            std::__cxx11::stringstream::stringstream((stringstream *)this_00);
            *(undefined8 *)
             ((long)&(this_00->message).c_str_ + *(long *)(*(long *)&this_00->line + -0x18)) = 0x11;
            if (gtest_ar_2.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar5 = "";
            }
            else {
              pcVar5 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
            }
            iVar3 = 0x1a6;
            local_80.data_ = this_00;
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&gtest_ar_2.message_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_80.data_ = (AssertHelperData *)((ulong)local_80.data_._4_4_ << 0x20);
            paVar4 = (anon_enum_32 *)&position;
            testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                      ((internal *)&gtest_ar_2,"position","0u",(unsigned_long *)paVar4,
                       (uint *)&local_80);
            if (gtest_ar_2.success_ == false) {
              testing::Message::Message((Message *)&local_80);
              if (gtest_ar_2.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar5 = "";
              }
              else {
                pcVar5 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
              }
              iVar3 = 0x1a7;
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset(&gtest_ar_2.message_,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              r = cubeb_stream_get_latency(stream,&latency);
              local_80.data_ = local_80.data_ & 0xffffffff00000000;
              testing::internal::EqHelper<false>::Compare<int,__0>
                        (&gtest_ar_2.success_,(char *)&r,(int *)&local_80,paVar4);
              if (gtest_ar_2.success_ == false) {
                testing::Message::Message((Message *)&local_80);
                if (gtest_ar_2.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar5 = "";
                }
                else {
                  pcVar5 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
                }
                iVar3 = 0x1aa;
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset(&gtest_ar_2.message_,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                r = cubeb_stream_start(stream);
                local_80.data_ = local_80.data_ & 0xffffffff00000000;
                testing::internal::EqHelper<false>::Compare<int,__0>
                          (&gtest_ar_2.success_,(char *)&r,(int *)&local_80,paVar4);
                if (gtest_ar_2.success_ == false) {
                  testing::Message::Message((Message *)&local_80);
                  if (gtest_ar_2.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar5 = "";
                  }
                  else {
                    pcVar5 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  iVar3 = 0x1ad;
                }
                else {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset(&gtest_ar_2.message_,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  r = cubeb_stream_get_position(stream,&position);
                  local_80.data_ = local_80.data_ & 0xffffffff00000000;
                  testing::internal::EqHelper<false>::Compare<int,__0>
                            (&gtest_ar_2.success_,(char *)&r,(int *)&local_80,paVar4);
                  if (gtest_ar_2.success_ == false) {
                    testing::Message::Message((Message *)&local_80);
                    if (gtest_ar_2.message_.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar5 = "";
                    }
                    else {
                      pcVar5 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
                    }
                    iVar3 = 0x1b1;
                  }
                  else {
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset(&gtest_ar_2.message_,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                    r = cubeb_stream_get_latency(stream,&latency);
                    local_80.data_ = local_80.data_ & 0xffffffff00000000;
                    testing::internal::EqHelper<false>::Compare<int,__0>
                              (&gtest_ar_2.success_,(char *)&r,(int *)&local_80,paVar4);
                    if (gtest_ar_2.success_ == false) {
                      testing::Message::Message((Message *)&local_80);
                      if (gtest_ar_2.message_.ptr_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar5 = "";
                      }
                      else {
                        pcVar5 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
                      }
                      iVar3 = 0x1b4;
                    }
                    else {
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::reset(&gtest_ar_2.message_,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0);
                      r = cubeb_stream_stop(stream);
                      local_80.data_ = local_80.data_ & 0xffffffff00000000;
                      testing::internal::EqHelper<false>::Compare<int,__0>
                                (&gtest_ar_2.success_,(char *)&r,(int *)&local_80,paVar4);
                      if (gtest_ar_2.success_ == false) {
                        testing::Message::Message((Message *)&local_80);
                        if (gtest_ar_2.message_.ptr_ ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pcVar5 = "";
                        }
                        else {
                          pcVar5 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
                        }
                        iVar3 = 0x1b7;
                      }
                      else {
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::reset(&gtest_ar_2.message_,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0);
                        r = cubeb_stream_get_position(stream,&position);
                        local_80.data_ = local_80.data_ & 0xffffffff00000000;
                        testing::internal::EqHelper<false>::Compare<int,__0>
                                  (&gtest_ar_2.success_,(char *)&r,(int *)&local_80,paVar4);
                        if (gtest_ar_2.success_ == false) {
                          testing::Message::Message((Message *)&local_80);
                          if (gtest_ar_2.message_.ptr_ ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar5 = "";
                          }
                          else {
                            pcVar5 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
                          }
                          iVar3 = 0x1bb;
                        }
                        else {
                          testing::internal::
                          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::reset(&gtest_ar_2.message_,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0);
                          r = cubeb_stream_get_latency(stream,&latency);
                          local_80.data_ = local_80.data_ & 0xffffffff00000000;
                          testing::internal::EqHelper<false>::Compare<int,__0>
                                    (&gtest_ar_2.success_,(char *)&r,(int *)&local_80,paVar4);
                          if (gtest_ar_2.success_ != false) {
                            testing::internal::
                            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::reset(&gtest_ar_2.message_,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0);
                            cubeb_stream_destroy(stream);
                            cubeb_destroy(ctx);
                            return;
                          }
                          testing::Message::Message((Message *)&local_80);
                          if (gtest_ar_2.message_.ptr_ ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar5 = "";
                          }
                          else {
                            pcVar5 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
                          }
                          iVar3 = 0x1be;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          this_01 = &gtest_ar_2.message_;
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                     ,iVar3,pcVar5);
          testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_80);
          testing::internal::AssertHelper::~AssertHelper(&local_50);
          if (local_80.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_80.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_80.data_ + 8))();
            }
            local_80.data_ = (AssertHelperData *)0x0;
          }
          goto LAB_0010a716;
        }
        psVar2 = (stringstream *)operator_new(0x188);
        std::__cxx11::stringstream::stringstream(psVar2);
        *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
        if (gtest_ar_2.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
        }
        iVar3 = 0x1a2;
        position = (uint64_t)psVar2;
      }
      this_01 = &gtest_ar_2.message_;
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                 ,iVar3,pcVar5);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&position);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if (position != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (position != 0)) {
          (**(code **)(*(long *)position + 8))();
        }
        position = 0;
      }
      goto LAB_0010a716;
    }
    psVar2 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar2);
    *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    iVar3 = 0x197;
    gtest_ar_2._0_8_ = psVar2;
  }
  this_01 = &gtest_ar.message_;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&stream,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
             ,iVar3,pcVar5);
  testing::internal::AssertHelper::operator=((AssertHelper *)&stream,(Message *)&gtest_ar_2);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stream);
  if (gtest_ar_2._0_8_ != 0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && (gtest_ar_2._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar_2._0_8_ + 8))();
    }
    gtest_ar_2.success_ = false;
    gtest_ar_2._1_7_ = 0;
  }
LAB_0010a716:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(cubeb, basic_stream_operations)
{
  int r;
  cubeb * ctx;
  cubeb_stream * stream;
  cubeb_stream_params params;
  uint64_t position;
  uint32_t latency;

  r = common_init(&ctx, "test_sanity");
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(ctx, nullptr);

  params.format = STREAM_FORMAT;
  params.rate = STREAM_RATE;
  params.channels = STREAM_CHANNELS;
  params.layout = STREAM_LAYOUT;
  params.prefs = CUBEB_STREAM_PREF_NONE;

  r = cubeb_stream_init(ctx, &stream, "test", NULL, NULL, NULL, &params, STREAM_LATENCY,
                        test_data_callback, test_state_callback, &dummy);
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(stream, nullptr);

  /* position and latency before stream has started */
  r = cubeb_stream_get_position(stream, &position);
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_EQ(position, 0u);

  r = cubeb_stream_get_latency(stream, &latency);
  ASSERT_EQ(r, CUBEB_OK);

  r = cubeb_stream_start(stream);
  ASSERT_EQ(r, CUBEB_OK);

  /* position and latency after while stream running */
  r = cubeb_stream_get_position(stream, &position);
  ASSERT_EQ(r, CUBEB_OK);

  r = cubeb_stream_get_latency(stream, &latency);
  ASSERT_EQ(r, CUBEB_OK);

  r = cubeb_stream_stop(stream);
  ASSERT_EQ(r, CUBEB_OK);

  /* position and latency after stream has stopped */
  r = cubeb_stream_get_position(stream, &position);
  ASSERT_EQ(r, CUBEB_OK);

  r = cubeb_stream_get_latency(stream, &latency);
  ASSERT_EQ(r, CUBEB_OK);

  cubeb_stream_destroy(stream);
  cubeb_destroy(ctx);
}